

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::
encode_base64_generic<unsigned_char_const*,jsoncons::string_sink<std::__cxx11::string>>
          (uchar *first,uchar *last,char *alphabet,
          string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *result)

{
  undefined1 uVar1;
  char cVar2;
  char cVar3;
  undefined1 *puVar4;
  int iVar5;
  long in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  int j;
  int i;
  uchar fill;
  uchar a4 [4];
  uchar a3 [3];
  size_t count;
  int local_38;
  int iVar6;
  char cVar7;
  byte in_stack_ffffffffffffffd4;
  byte in_stack_ffffffffffffffd5;
  byte in_stack_ffffffffffffffd6;
  byte in_stack_ffffffffffffffd7;
  type_conflict2 local_28;
  undefined1 *local_8;
  
  local_28 = 0;
  cVar7 = *(char *)(in_RDX + 0x40);
  iVar6 = 0;
  local_8 = in_RDI;
  while (local_8 != in_RSI) {
    puVar4 = local_8 + 1;
    iVar5 = iVar6 + 1;
    (&stack0xffffffffffffffd5)[iVar6] = *local_8;
    iVar6 = iVar5;
    local_8 = puVar4;
    if (iVar5 == 3) {
      uVar1 = (undefined1)((int)(in_stack_ffffffffffffffd5 & 0xfc) >> 2);
      cVar2 = (in_stack_ffffffffffffffd5 & 3) * '\x10' +
              (char)((int)(in_stack_ffffffffffffffd6 & 0xf0) >> 4);
      cVar3 = (in_stack_ffffffffffffffd6 & 0xf) * '\x04' +
              (char)((int)(in_stack_ffffffffffffffd7 & 0xc0) >> 6);
      in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd7 & 0x3f;
      for (iVar6 = 0; iVar6 < 4; iVar6 = iVar6 + 1) {
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffd7,
                                CONCAT16(in_stack_ffffffffffffffd6,
                                         CONCAT15(in_stack_ffffffffffffffd5,
                                                  CONCAT14(in_stack_ffffffffffffffd4,
                                                           CONCAT13(cVar3,CONCAT12(cVar2,CONCAT11(
                                                  uVar1,cVar7))))))),
                    (value_type)((uint)iVar6 >> 0x18));
        local_28 = local_28 + 1;
      }
      iVar6 = 0;
    }
  }
  local_38 = iVar6;
  if (0 < iVar6) {
    for (; local_38 < 3; local_38 = local_38 + 1) {
      (&stack0xffffffffffffffd5)[local_38] = 0;
    }
    uVar1 = (undefined1)((int)(in_stack_ffffffffffffffd5 & 0xfc) >> 2);
    cVar2 = (in_stack_ffffffffffffffd5 & 3) * '\x10' +
            (char)((int)(in_stack_ffffffffffffffd6 & 0xf0) >> 4);
    cVar3 = (in_stack_ffffffffffffffd6 & 0xf) * '\x04' +
            (char)((int)(in_stack_ffffffffffffffd7 & 0xc0) >> 6);
    for (local_38 = 0; local_38 < iVar6 + 1; local_38 = local_38 + 1) {
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffd7,
                              CONCAT16(in_stack_ffffffffffffffd6,
                                       CONCAT15(in_stack_ffffffffffffffd5,
                                                CONCAT14(in_stack_ffffffffffffffd4,
                                                         CONCAT13(cVar3,CONCAT12(cVar2,CONCAT11(
                                                  uVar1,cVar7))))))),
                  (value_type)((uint)iVar6 >> 0x18));
      local_28 = local_28 + 1;
    }
    if (cVar7 != '\0') {
      while (iVar6 < 3) {
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffd7,
                                CONCAT16(in_stack_ffffffffffffffd6,
                                         CONCAT15(in_stack_ffffffffffffffd5,
                                                  CONCAT14(in_stack_ffffffffffffffd4,
                                                           CONCAT13(cVar3,CONCAT12(cVar2,CONCAT11(
                                                  uVar1,cVar7))))))),
                    (value_type)((uint)(iVar6 + 1) >> 0x18));
        local_28 = local_28 + 1;
        iVar6 = iVar6 + 1;
      }
    }
  }
  return local_28;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }